

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
duckdb::LogicalType::GetAlias_abi_cxx11_(string *__return_storage_ptr__,LogicalType *this)

{
  string *psVar1;
  ExtraTypeInfo *pEVar2;
  
  if (this->id_ == USER) {
    psVar1 = UserType::GetTypeName_abi_cxx11_(this);
  }
  else {
    if ((this->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    pEVar2 = shared_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&this->type_info_);
    psVar1 = &pEVar2->alias;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

string LogicalType::GetAlias() const {
	if (id() == LogicalTypeId::USER) {
		return UserType::GetTypeName(*this);
	}
	if (type_info_) {
		return type_info_->alias;
	}
	return string();
}